

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replace_desc_array_access_using_var_index.cpp
# Opt level: O2

deque<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> * __thiscall
spvtools::opt::ReplaceDescArrayAccessUsingVarIndex::CollectRequiredImageAndAccessInsts
          (deque<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
           *__return_storage_ptr__,ReplaceDescArrayAccessUsingVarIndex *this,Instruction *user)

{
  Instruction *pIVar1;
  Instruction *inst_from_work_list;
  _Any_data local_f8;
  code *local_e8;
  Instruction *user_local;
  anon_class_24_3_4350207c decision_to_include_operand;
  queue<spvtools::opt::Instruction_*,_std::deque<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
  work_list;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  seen_inst_ids;
  
  seen_inst_ids._M_h._M_buckets = &seen_inst_ids._M_h._M_single_bucket;
  seen_inst_ids._M_h._M_bucket_count = 1;
  seen_inst_ids._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  seen_inst_ids._M_h._M_element_count = 0;
  seen_inst_ids._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  seen_inst_ids._M_h._M_rehash_policy._M_next_resize = 0;
  seen_inst_ids._M_h._M_single_bucket = (__node_base_ptr)0x0;
  user_local = user;
  std::
  queue<spvtools::opt::Instruction*,std::deque<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>>
  ::queue<std::deque<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>,void>
            (&work_list);
  decision_to_include_operand.seen_inst_ids = &seen_inst_ids;
  decision_to_include_operand.this = this;
  decision_to_include_operand.work_list = &work_list;
  std::_Deque_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
  _Deque_base(&__return_storage_ptr__->
               super__Deque_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
             );
  std::deque<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
  push_front(__return_storage_ptr__,&user_local);
  pIVar1 = user_local;
  std::function<void(unsigned_int*)>::
  function<spvtools::opt::ReplaceDescArrayAccessUsingVarIndex::CollectRequiredImageAndAccessInsts(spvtools::opt::Instruction*)const::__0&,void>
            ((function<void(unsigned_int*)> *)local_f8._M_pod_data,&decision_to_include_operand);
  Instruction::ForEachInId(pIVar1,(function<void_(unsigned_int_*)> *)&local_f8);
  if (local_e8 != (code *)0x0) {
    (*local_e8)(&local_f8,&local_f8,__destroy_functor);
  }
  while (work_list.c.
         super__Deque_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
         ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
         work_list.c.
         super__Deque_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
         ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    inst_from_work_list =
         *work_list.c.
          super__Deque_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
          ._M_impl.super__Deque_impl_data._M_start._M_cur;
    std::deque<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
    pop_front(&work_list.c);
    std::deque<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
    push_front(__return_storage_ptr__,&inst_from_work_list);
    pIVar1 = inst_from_work_list;
    std::function<void(unsigned_int*)>::
    function<spvtools::opt::ReplaceDescArrayAccessUsingVarIndex::CollectRequiredImageAndAccessInsts(spvtools::opt::Instruction*)const::__0&,void>
              ((function<void(unsigned_int*)> *)local_f8._M_pod_data,&decision_to_include_operand);
    Instruction::ForEachInId(pIVar1,(function<void_(unsigned_int_*)> *)&local_f8);
    if (local_e8 != (code *)0x0) {
      (*local_e8)(&local_f8,&local_f8,__destroy_functor);
    }
  }
  std::_Deque_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
  ~_Deque_base((_Deque_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                *)&work_list);
  std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&seen_inst_ids._M_h);
  return __return_storage_ptr__;
}

Assistant:

std::deque<Instruction*>
ReplaceDescArrayAccessUsingVarIndex::CollectRequiredImageAndAccessInsts(
    Instruction* user) const {
  std::unordered_set<uint32_t> seen_inst_ids;
  std::queue<Instruction*> work_list;

  auto decision_to_include_operand = [this, &seen_inst_ids,
                                      &work_list](uint32_t* idp) {
    if (!seen_inst_ids.insert(*idp).second) return;
    Instruction* operand = get_def_use_mgr()->GetDef(*idp);
    if (context()->get_instr_block(operand) != nullptr &&
        (HasImageOrImagePtrType(operand) ||
         operand->opcode() == spv::Op::OpAccessChain ||
         operand->opcode() == spv::Op::OpInBoundsAccessChain)) {
      work_list.push(operand);
    }
  };

  std::deque<Instruction*> required_insts;
  required_insts.push_front(user);
  user->ForEachInId(decision_to_include_operand);
  while (!work_list.empty()) {
    auto* inst_from_work_list = work_list.front();
    work_list.pop();
    required_insts.push_front(inst_from_work_list);
    inst_from_work_list->ForEachInId(decision_to_include_operand);
  }
  return required_insts;
}